

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io-window.cc
# Opt level: O1

void (anonymous_namespace)::
     TextCgbPal<(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg>
               (Emulator *e,char *name,CgbSwatchArg args,CgbSwatchArg args_1,CgbSwatchArg args_2,
               CgbSwatchArg args_3)

{
  ImU32 IVar1;
  CgbSwatchArg CVar2;
  Emulator *e_00;
  ImDrawList *pIVar3;
  int color_index;
  float fVar4;
  PaletteRGBA PVar5;
  PaletteRGBA pal_rgba;
  ImVec2 p;
  ImVec2 p_1;
  ImVec2 p_2;
  char buf [15];
  undefined1 local_b0 [16];
  Emulator *local_a0;
  undefined8 local_98;
  undefined1 local_90 [16];
  ImVec2 local_80;
  RGBA local_78 [4];
  RGBA local_68 [4];
  ImVec2 local_58;
  ImVec2 local_50;
  ImVec2 local_48;
  char local_3f [15];
  
  CVar2 = args_2;
  local_b0._8_8_ = local_b0._0_8_;
  local_98 = args_1._0_8_;
  local_a0 = e;
  snprintf(local_3f,0xf,"[%s]",name);
  ImGui::Text("   %8s:   ",local_3f);
  ImGui::SameLine(0.0,-1.0);
  local_90._0_4_ = args_2.type;
  local_90._4_4_ = args_2.palette_index;
  local_90._8_4_ = args_3.type;
  local_90._12_4_ = args_3.palette_index;
  local_78 = (RGBA  [4])emulator_get_cgb_palette_rgba(e,args.type,args.palette_index);
  ImGui::SameLine(0.0,-1.0);
  ImGui::Text("%d:",(ulong)(uint)args.color_index);
  IVar1 = local_78[0xe4U >> ((char)args.color_index * '\x02' & 0x1fU) & 3];
  fVar4 = ImGui::GetTextLineHeight();
  ImGui::SameLine(0.0,-1.0);
  local_58 = ImGui::GetCursorScreenPos();
  pIVar3 = ImGui::GetWindowDrawList();
  local_b0._4_4_ = local_58.y + fVar4;
  local_b0._0_4_ = local_58.x + fVar4;
  ImDrawList::AddRectFilled(pIVar3,&local_58,(ImVec2 *)local_b0,IVar1,0.0,0);
  local_b0._4_4_ = fVar4;
  local_b0._0_4_ = fVar4;
  ImGui::Dummy((ImVec2 *)local_b0);
  e_00 = local_a0;
  local_68 = (RGBA  [4])
             emulator_get_cgb_palette_rgba
                       (local_a0,(CgbPaletteType)local_98,(int)((ulong)local_98 >> 0x20));
  ImGui::SameLine(0.0,-1.0);
  ImGui::Text("%d:",(ulong)(uint)args_1.color_index);
  IVar1 = local_68[0xe4U >> ((char)args_1.color_index * '\x02' & 0x1fU) & 3];
  fVar4 = ImGui::GetTextLineHeight();
  ImGui::SameLine(0.0,-1.0);
  local_50 = ImGui::GetCursorScreenPos();
  pIVar3 = ImGui::GetWindowDrawList();
  local_b0._4_4_ = local_50.y + fVar4;
  local_b0._0_4_ = local_50.x + fVar4;
  ImDrawList::AddRectFilled(pIVar3,&local_50,(ImVec2 *)local_b0,IVar1,0.0,0);
  local_b0._4_4_ = fVar4;
  local_b0._0_4_ = fVar4;
  ImGui::Dummy((ImVec2 *)local_b0);
  local_b0 = (undefined1  [16])
             emulator_get_cgb_palette_rgba
                       (e_00,(CgbPaletteType)local_90._0_8_,SUB84(local_90._0_8_,4));
  ImGui::SameLine(0.0,-1.0);
  ImGui::Text("%d:",(ulong)(uint)args_2.color_index);
  IVar1 = *(ImU32 *)(local_b0 + (ulong)(0xe4U >> ((char)CVar2.color_index * '\x02' & 0x1fU) & 3) * 4
                    );
  fVar4 = ImGui::GetTextLineHeight();
  ImGui::SameLine(0.0,-1.0);
  local_48 = ImGui::GetCursorScreenPos();
  pIVar3 = ImGui::GetWindowDrawList();
  local_80.x = local_48.x + fVar4;
  local_80.y = local_48.y + fVar4;
  color_index = 0;
  ImDrawList::AddRectFilled(pIVar3,&local_48,&local_80,IVar1,0.0,0);
  local_80.x = fVar4;
  local_80.y = fVar4;
  ImGui::Dummy(&local_80);
  PVar5 = emulator_get_cgb_palette_rgba(e_00,(CgbPaletteType)local_90._8_8_,SUB84(local_90._8_8_,4))
  ;
  pal_rgba.color._0_8_ = PVar5.color._8_8_;
  pal_rgba.color[2] = args_3.color_index;
  pal_rgba.color[3] = 0;
  anon_unknown.dwarf_b4179::ColorSwatchTextRegBits<>
            ((Emulator *)0xe4,(u8)PVar5.color[0],pal_rgba,color_index);
  return;
}

Assistant:

void TextCgbPal(Emulator* e, const char* name, Args... args) {
  const ImVec4 kRegColor(1.f, 0.75f, 0.3f, 1.f);

  char buf[15];
  u8 v = 0xE4; // Always use normal order.
  snprintf(buf, sizeof(buf), "[%s]", name);
  ImGui::Text("   %8s:   ", buf);
  ImGui::SameLine();
  TextRegBits(e, v, args...);
}